

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O0

char * kwsysSystem_Shell__GetArgument(char *in,char *out,int isUnix,int flags)

{
  int iVar1;
  char *pcVar2;
  char *skip;
  int needQuotes;
  int windows_backslashes;
  char *c;
  int flags_local;
  int isUnix_local;
  char *out_local;
  char *in_local;
  
  skip._4_4_ = 0;
  iVar1 = kwsysSystem_Shell__ArgumentNeedsQuotes(in,isUnix,flags);
  _needQuotes = in;
  _flags_local = out;
  if (iVar1 != 0) {
    if ((flags & 0x80U) == 0) {
      _flags_local = out + 1;
      *out = '\"';
    }
    else {
      _flags_local = out;
      if (isUnix != 0) {
        _flags_local = out + 1;
        *out = '\"';
      }
      *_flags_local = '\'';
      _flags_local = _flags_local + 1;
    }
  }
  for (; *_needQuotes != '\0'; _needQuotes = _needQuotes + 1) {
    if (((flags & 0x40U) != 0) &&
       (pcVar2 = kwsysSystem_Shell__SkipMakeVariables(_needQuotes), pcVar2 != _needQuotes)) {
      while (_needQuotes != pcVar2) {
        *_flags_local = *_needQuotes;
        _needQuotes = _needQuotes + 1;
        _flags_local = _flags_local + 1;
      }
      skip._4_4_ = 0;
      if (*_needQuotes == '\0') break;
    }
    if (isUnix == 0) {
      if ((flags & 4U) == 0) {
        if (*_needQuotes == '\\') {
          skip._4_4_ = skip._4_4_ + 1;
        }
        else if (*_needQuotes == '\"') {
          while (0 < skip._4_4_) {
            skip._4_4_ = skip._4_4_ + -1;
            *_flags_local = '\\';
            _flags_local = _flags_local + 1;
          }
          *_flags_local = '\\';
          _flags_local = _flags_local + 1;
        }
        else {
          skip._4_4_ = 0;
        }
      }
    }
    else if ((((*_needQuotes == '\\') || (*_needQuotes == '\"')) || (*_needQuotes == '`')) ||
            (*_needQuotes == '$')) {
      *_flags_local = '\\';
      _flags_local = _flags_local + 1;
    }
    if (*_needQuotes == '$') {
      if ((flags & 1U) == 0) {
        if ((flags & 2U) == 0) {
          *_flags_local = '$';
          _flags_local = _flags_local + 1;
        }
        else {
          *_flags_local = '\"';
          _flags_local[1] = '$';
          _flags_local[2] = '\"';
          _flags_local = _flags_local + 3;
        }
      }
      else {
        *_flags_local = '$';
        _flags_local[1] = '$';
        _flags_local = _flags_local + 2;
      }
    }
    else if (*_needQuotes == '#') {
      if (((flags & 1U) == 0) || ((flags & 8U) == 0)) {
        *_flags_local = '#';
        _flags_local = _flags_local + 1;
      }
      else {
        *_flags_local = '$';
        _flags_local[1] = '#';
        _flags_local = _flags_local + 2;
      }
    }
    else if (*_needQuotes == '%') {
      if (((flags & 2U) == 0) &&
         (((flags & 1U) == 0 || (((flags & 0x10U) == 0 && ((flags & 0x20U) == 0)))))) {
        *_flags_local = '%';
        _flags_local = _flags_local + 1;
      }
      else {
        *_flags_local = '%';
        _flags_local[1] = '%';
        _flags_local = _flags_local + 2;
      }
    }
    else if (*_needQuotes == ';') {
      if ((flags & 2U) == 0) {
        *_flags_local = ';';
        _flags_local = _flags_local + 1;
      }
      else {
        *_flags_local = '\"';
        _flags_local[1] = ';';
        _flags_local[2] = '\"';
        _flags_local = _flags_local + 3;
      }
    }
    else {
      *_flags_local = *_needQuotes;
      _flags_local = _flags_local + 1;
    }
  }
  pcVar2 = _flags_local;
  if (iVar1 != 0) {
    while (0 < skip._4_4_) {
      skip._4_4_ = skip._4_4_ + -1;
      *_flags_local = '\\';
      _flags_local = _flags_local + 1;
    }
    if ((flags & 0x80U) == 0) {
      *_flags_local = '\"';
      pcVar2 = _flags_local + 1;
    }
    else {
      *_flags_local = '\'';
      pcVar2 = _flags_local + 1;
      if (isUnix != 0) {
        _flags_local[1] = '\"';
        pcVar2 = _flags_local + 2;
      }
    }
  }
  _flags_local = pcVar2;
  *_flags_local = '\0';
  return _flags_local;
}

Assistant:

static char* kwsysSystem_Shell__GetArgument(const char* in, char* out,
                                            int isUnix, int flags)
{
  /* String iterator.  */
  const char* c;

  /* Keep track of how many backslashes have been encountered in a row.  */
  int windows_backslashes = 0;

  /* Whether the argument must be quoted.  */
  int needQuotes = kwsysSystem_Shell__ArgumentNeedsQuotes(in, isUnix, flags);
  if(needQuotes)
    {
    /* Add the opening quote for this argument.  */
    if(flags & kwsysSystem_Shell_Flag_WatcomQuote)
      {
      if(isUnix)
        {
        *out++ = '"';
        }
      *out++ = '\'';
      }
    else
      {
      *out++ = '"';
      }
    }

  /* Scan the string for characters that require escaping or quoting.  */
  for(c=in; *c; ++c)
    {
    /* Look for $(MAKEVAR) syntax if requested.  */
    if(flags & kwsysSystem_Shell_Flag_AllowMakeVariables)
      {
      const char* skip = kwsysSystem_Shell__SkipMakeVariables(c);
      if(skip != c)
        {
        /* Copy to the end of the make variable references.  */
        while(c != skip)
          {
          *out++ = *c++;
          }

        /* The make variable reference eliminates any escaping needed
           for preceding backslashes.  */
        windows_backslashes = 0;

        /* Stop if we have reached the end of the string.  */
        if(!*c)
          {
          break;
          }
        }
      }

    /* Check whether this character needs escaping for the shell.  */
    if(isUnix)
      {
      /* On Unix a few special characters need escaping even inside a
         quoted argument.  */
      if(*c == '\\' || *c == '"' || *c == '`' || *c == '$')
        {
        /* This character needs a backslash to escape it.  */
        *out++ = '\\';
        }
      }
    else if(flags & kwsysSystem_Shell_Flag_EchoWindows)
      {
      /* On Windows the built-in command shell echo never needs escaping.  */
      }
    else
      {
      /* On Windows only backslashes and double-quotes need escaping.  */
      if(*c == '\\')
        {
        /* Found a backslash.  It may need to be escaped later.  */
        ++windows_backslashes;
        }
      else if(*c == '"')
        {
        /* Found a double-quote.  Escape all immediately preceding
           backslashes.  */
        while(windows_backslashes > 0)
          {
          --windows_backslashes;
          *out++ = '\\';
          }

        /* Add the backslash to escape the double-quote.  */
        *out++ = '\\';
        }
      else
        {
        /* We encountered a normal character.  This eliminates any
           escaping needed for preceding backslashes.  */
        windows_backslashes = 0;
        }
      }

    /* Check whether this character needs escaping for a make tool.  */
    if(*c == '$')
      {
      if(flags & kwsysSystem_Shell_Flag_Make)
        {
        /* In Makefiles a dollar is written $$.  The make tool will
           replace it with just $ before passing it to the shell.  */
        *out++ = '$';
        *out++ = '$';
        }
      else if(flags & kwsysSystem_Shell_Flag_VSIDE)
        {
        /* In a VS IDE a dollar is written "$".  If this is written in
           an un-quoted argument it starts a quoted segment, inserts
           the $ and ends the segment.  If it is written in a quoted
           argument it ends quoting, inserts the $ and restarts
           quoting.  Either way the $ is isolated from surrounding
           text to avoid looking like a variable reference.  */
        *out++ = '"';
        *out++ = '$';
        *out++ = '"';
        }
      else
        {
        /* Otherwise a dollar is written just $. */
        *out++ = '$';
        }
      }
    else if(*c == '#')
      {
      if((flags & kwsysSystem_Shell_Flag_Make) &&
         (flags & kwsysSystem_Shell_Flag_WatcomWMake))
        {
        /* In Watcom WMake makefiles a pound is written $#.  The make
           tool will replace it with just # before passing it to the
           shell.  */
        *out++ = '$';
        *out++ = '#';
        }
      else
        {
        /* Otherwise a pound is written just #. */
        *out++ = '#';
        }
      }
    else if(*c == '%')
      {
      if((flags & kwsysSystem_Shell_Flag_VSIDE) ||
         ((flags & kwsysSystem_Shell_Flag_Make) &&
          ((flags & kwsysSystem_Shell_Flag_MinGWMake) ||
           (flags & kwsysSystem_Shell_Flag_NMake))))
        {
        /* In the VS IDE, NMake, or MinGW make a percent is written %%.  */
        *out++ = '%';
        *out++ = '%';
        }
      else
        {
        /* Otherwise a percent is written just %. */
        *out++ = '%';
        }
      }
    else if(*c == ';')
      {
      if(flags & kwsysSystem_Shell_Flag_VSIDE)
        {
        /* In a VS IDE a semicolon is written ";".  If this is written
           in an un-quoted argument it starts a quoted segment,
           inserts the ; and ends the segment.  If it is written in a
           quoted argument it ends quoting, inserts the ; and restarts
           quoting.  Either way the ; is isolated.  */
        *out++ = '"';
        *out++ = ';';
        *out++ = '"';
        }
      else
        {
        /* Otherwise a semicolon is written just ;. */
        *out++ = ';';
        }
      }
    else
      {
      /* Store this character.  */
      *out++ = *c;
      }
    }

  if(needQuotes)
    {
    /* Add enough backslashes to escape any trailing ones.  */
    while(windows_backslashes > 0)
      {
      --windows_backslashes;
      *out++ = '\\';
      }

    /* Add the closing quote for this argument.  */
    if(flags & kwsysSystem_Shell_Flag_WatcomQuote)
      {
      *out++ = '\'';
      if(isUnix)
        {
        *out++ = '"';
        }
      }
    else
      {
      *out++ = '"';
      }
    }

  /* Store a terminating null without incrementing.  */
  *out = 0;

  return out;
}